

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

void nni_http_set_body(nng_http *conn,void *data,size_t size)

{
  char *__s;
  nng_http_req *pnVar1;
  _Bool *p_Var2;
  long lVar3;
  nng_http_res *pnVar4;
  
  if (conn->client == true) {
    pnVar1 = &conn->req;
    p_Var2 = &(conn->req).data.own;
    lVar3 = 0x410;
    if ((conn->req).data.own == false) goto LAB_00135019;
  }
  else {
    pnVar1 = (nng_http_req *)&conn->res;
    p_Var2 = &(conn->res).data.own;
    lVar3 = 0x538;
    if ((conn->res).data.own != true) goto LAB_00135019;
  }
  nni_free((pnVar1->data).data,*(size_t *)((long)&conn->sock + lVar3));
LAB_00135019:
  (pnVar1->data).data = (char *)data;
  *(size_t *)((long)&conn->sock + lVar3) = size;
  *p_Var2 = false;
  pnVar4 = &conn->res;
  if (conn->client != false) {
    pnVar4 = (nng_http_res *)&conn->req;
  }
  __s = (pnVar4->data).clen;
  snprintf(__s,0x18,"%lu",size);
  nni_http_set_static_header(conn,&(pnVar4->data).content_length,"Content-Length",__s);
  return;
}

Assistant:

void
nni_http_set_body(nng_http *conn, void *data, size_t size)
{
	if (conn->client) {
		http_set_data(&conn->req.data, data, size);
	} else {
		http_set_data(&conn->res.data, data, size);
	}
	nni_http_set_content_length(conn, size);
}